

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O3

char * EncodeObservation(pyhanabi_observation_encoder_t *encoder,pyhanabi_observation_t *observation
                        )

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  void *pvVar4;
  ulong uVar5;
  vector<int,_std::allocator<int>_> encoding;
  string obs_str;
  void *local_68;
  void *local_60;
  char *local_50 [2];
  char local_40 [16];
  
  if (encoder == (pyhanabi_observation_encoder_t *)0x0) {
    __assert_fail("encoder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x363,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if ((long *)encoder->encoder == (long *)0x0) {
    __assert_fail("encoder->encoder != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x364,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (observation == (pyhanabi_observation_t *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x365,
                  "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
                 );
  }
  if (observation->observation != (void *)0x0) {
    (**(code **)(*encoder->encoder + 0x18))(&local_68);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    if (local_60 != local_68) {
      uVar5 = 0;
      do {
        std::__cxx11::string::append((char *)local_50);
        uVar2 = (long)local_60 - (long)local_68 >> 2;
        if (uVar5 != uVar2 - 1) {
          std::__cxx11::string::append((char *)local_50);
          uVar2 = (long)local_60 - (long)local_68 >> 2;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
    pcVar1 = local_50[0];
    pvVar4 = local_68;
    pcVar3 = strdup(local_50[0]);
    if (pcVar1 != local_40) {
      operator_delete(pcVar1);
      pvVar4 = local_68;
    }
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4);
    }
    return pcVar3;
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x366,
                "char *EncodeObservation(pyhanabi_observation_encoder_t *, pyhanabi_observation_t *)"
               );
}

Assistant:

char* EncodeObservation(pyhanabi_observation_encoder_t* encoder,
                        pyhanabi_observation_t* observation) {
  REQUIRE(encoder != nullptr);
  REQUIRE(encoder->encoder != nullptr);
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  auto obs_enc = reinterpret_cast<hanabi_learning_env::ObservationEncoder*>(
      encoder->encoder);
  auto obs = reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
      observation->observation);
  std::vector<int> encoding = obs_enc->Encode(*obs);
  std::string obs_str = "";
  for (int i = 0; i < encoding.size(); i++) {
    obs_str += (encoding[i] ? "1" : "0");
    if (i != encoding.size() - 1) {
      obs_str += ",";
    }
  }
  return strdup(obs_str.c_str());
}